

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::TextureLevelPyramid::allocLevel
          (TextureLevelPyramid *this,int levelNdx,int width,int height,int depth)

{
  TextureFormat format;
  void *pvVar1;
  pointer pPVar2;
  int iVar3;
  
  iVar3 = getPixelSize(this->m_format);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
            ((this->m_data).
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start + levelNdx,
             (long)(height * width * depth * iVar3));
  format = this->m_format;
  pvVar1 = (this->m_data).
           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[levelNdx].m_ptr;
  iVar3 = getPixelSize(format);
  pPVar2 = (this->m_access).
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *(TextureFormat *)(pPVar2 + levelNdx) = format;
  pPVar2[levelNdx].super_ConstPixelBufferAccess.m_size.m_data[0] = width;
  *(int *)((long)pPVar2[levelNdx].super_ConstPixelBufferAccess.m_size.m_data + 4) = height;
  *(int *)((long)pPVar2[levelNdx].super_ConstPixelBufferAccess.m_size.m_data + 8) = depth;
  pPVar2[levelNdx].super_ConstPixelBufferAccess.m_pitch.m_data[0] = iVar3;
  *(int *)((long)pPVar2[levelNdx].super_ConstPixelBufferAccess.m_pitch.m_data + 4) = iVar3 * width;
  *(int *)((long)pPVar2[levelNdx].super_ConstPixelBufferAccess.m_pitch.m_data + 8) =
       iVar3 * width * height;
  pPVar2[levelNdx].super_ConstPixelBufferAccess.m_data = pvVar1;
  return;
}

Assistant:

void TextureLevelPyramid::allocLevel (int levelNdx, int width, int height, int depth)
{
	const int	size	= m_format.getPixelSize()*width*height*depth;

	DE_ASSERT(isLevelEmpty(levelNdx));

	m_data[levelNdx].setStorage(size);
	m_access[levelNdx] = PixelBufferAccess(m_format, width, height, depth, m_data[levelNdx].getPtr());
}